

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_impl.hpp
# Opt level: O0

void __thiscall lightconf::value::value(value *this,group *grp)

{
  group *grp_local;
  value *this_local;
  
  this->type_ = group_type;
  std::__cxx11::string::string((string *)&this->string_value_);
  std::vector<lightconf::value,_std::allocator<lightconf::value>_>::vector(&this->vector_value_);
  group::group(&this->group_value_,grp);
  return;
}

Assistant:

inline value::value(const group& grp)           : type_(value_type::group_type), group_value_(grp) { }